

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O3

void __thiscall
Js::
CopyRemovePolicy<JsUtil::List<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
::RemoveAt(CopyRemovePolicy<JsUtil::List<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
           *this,List<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 *list,int index)

{
  Type pNVar1;
  undefined8 uVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  undefined4 *puVar6;
  long lVar7;
  long lVar8;
  
  if ((index < 0) ||
     (iVar5 = (list->
              super_ReadOnlyList<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_DefaultComparer>
              ).count, iVar5 <= index)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/List.h"
                                ,0x2ee,"(index >= 0 && index < list->count)",
                                "index >= 0 && index < list->count");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
    iVar5 = (list->
            super_ReadOnlyList<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_DefaultComparer>
            ).count;
  }
  if (index + 1 < iVar5) {
    lVar7 = (long)(index + 1);
    lVar8 = lVar7 * 0xc;
    do {
      pNVar1 = (list->
               super_ReadOnlyList<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_DefaultComparer>
               ).buffer;
      pNVar1[index].nativeOffsetSpan.end = *(Type *)((long)&(pNVar1->nativeOffsetSpan).end + lVar8);
      uVar2 = *(undefined8 *)((long)&pNVar1->statementIndex + lVar8);
      pNVar1[index].statementIndex = (int)uVar2;
      pNVar1[index].nativeOffsetSpan.begin = (int)((ulong)uVar2 >> 0x20);
      index = index + 1;
      lVar7 = lVar7 + 1;
      iVar5 = (list->
              super_ReadOnlyList<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_DefaultComparer>
              ).count;
      lVar8 = lVar8 + 0xc;
    } while (lVar7 < iVar5);
  }
  iVar5 = iVar5 + -1;
  (list->
  super_ReadOnlyList<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_DefaultComparer>)
  .count = iVar5;
  pNVar1 = (list->
           super_ReadOnlyList<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_DefaultComparer>
           ).buffer;
  pNVar1[iVar5].nativeOffsetSpan.end = 0;
  pNVar1 = pNVar1 + iVar5;
  pNVar1->statementIndex = 0;
  (pNVar1->nativeOffsetSpan).begin = 0;
  return;
}

Assistant:

void RemoveAt(TListType* list, int index)
        {
            Assert(index >= 0 && index < list->count);
            for (int j = index + 1; j < list->count; index++, j++)
            {
                list->buffer[index] = list->buffer[j];
            }
            list->count--;

            if (clearOldEntries)
            {
                ClearArray(list->buffer + list->count, 1);
            }
        }